

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::begin_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  iterator *piVar1;
  _Elt_pointer ppSVar2;
  SPIRFunction *func;
  SPIRFunction *local_28;
  
  if (2 < length) {
    func = Variant::get<spirv_cross::SPIRFunction>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + args[2])
    ;
    push_remap_parameters(this,func,args + 3,length - 3);
    ppSVar2 = (this->functions).c.
              super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppSVar2 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_28 = func;
      ::std::deque<spirv_cross::SPIRFunction*,std::allocator<spirv_cross::SPIRFunction*>>::
      _M_push_back_aux<spirv_cross::SPIRFunction*>
                ((deque<spirv_cross::SPIRFunction*,std::allocator<spirv_cross::SPIRFunction*>> *)
                 &this->functions,&local_28);
    }
    else {
      *ppSVar2 = func;
      piVar1 = &(this->functions).c.
                super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;
	length -= 3;
	push_remap_parameters(callee, args, length);
	functions.push(&callee);
	return true;
}